

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int set_ports_option(mg_context *phys_ctx)

{
  undefined8 *puVar1;
  bool bVar2;
  undefined8 uVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  char *list;
  ulong uVar7;
  uint *puVar8;
  char *pcVar9;
  long lVar10;
  socket *__ptr;
  pollfd *ppVar11;
  uint uVar12;
  uint *puVar13;
  int *piVar14;
  char *func;
  char *func_00;
  char *extraout_RDX;
  char *extraout_RDX_00;
  ulong uVar15;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *func_01;
  mg_context *ctx;
  char *extraout_RDX_06;
  int iVar16;
  char *pcVar17;
  char *pcVar18;
  char *pcVar19;
  bool bVar20;
  int len_1;
  uint port;
  char *local_268;
  vec vec;
  socklen_t len;
  socket so;
  int on;
  ulong local_1f8;
  int off;
  uint d;
  uint c;
  uint b;
  uint a;
  mg_context *local_1d8;
  char *endptr;
  usa usa;
  char buf [100];
  char local_138 [264];
  
  on = 1;
  off = 0;
  so._0_8_ = 0;
  so.lsa._4_8_ = 0;
  so.lsa._12_8_ = 0;
  so.lsa._20_8_ = 0;
  so.rsa._0_8_ = 0;
  so.rsa._8_1_ = '\0';
  so.rsa._9_1_ = '\0';
  so.rsa._10_1_ = '\0';
  so.rsa._11_1_ = '\0';
  so.rsa._12_1_ = '\0';
  so.rsa._13_1_ = '\0';
  so.rsa._14_1_ = '\0';
  so.rsa._15_1_ = '\0';
  so.rsa._16_8_ = 0;
  so._56_8_ = 0;
  usa._0_8_ = 0;
  usa._8_4_ = 0;
  usa._12_4_ = 0;
  usa._16_4_ = 0;
  usa._20_8_ = 0;
  len = 0x1c;
  local_1f8 = 0;
  list = next_option((phys_ctx->dd).config[0],&vec,(vec *)0x0);
  local_268 = (char *)0x0;
  if (list != (char *)0x0) {
    local_268 = (char *)0x0;
    local_1f8 = 0;
    local_1d8 = phys_ctx;
    do {
      buf[0x60] = '\0';
      buf[0x61] = '\0';
      buf[0x62] = '\0';
      buf[99] = '\0';
      buf[0x50] = '\0';
      buf[0x51] = '\0';
      buf[0x52] = '\0';
      buf[0x53] = '\0';
      buf[0x54] = '\0';
      buf[0x55] = '\0';
      buf[0x56] = '\0';
      buf[0x57] = '\0';
      buf[0x58] = '\0';
      buf[0x59] = '\0';
      buf[0x5a] = '\0';
      buf[0x5b] = '\0';
      buf[0x5c] = '\0';
      buf[0x5d] = '\0';
      buf[0x5e] = '\0';
      buf[0x5f] = '\0';
      buf[0x40] = '\0';
      buf[0x41] = '\0';
      buf[0x42] = '\0';
      buf[0x43] = '\0';
      buf[0x44] = '\0';
      buf[0x45] = '\0';
      buf[0x46] = '\0';
      buf[0x47] = '\0';
      buf[0x48] = '\0';
      buf[0x49] = '\0';
      buf[0x4a] = '\0';
      buf[0x4b] = '\0';
      buf[0x4c] = '\0';
      buf[0x4d] = '\0';
      buf[0x4e] = '\0';
      buf[0x4f] = '\0';
      buf[0x30] = '\0';
      buf[0x31] = '\0';
      buf[0x32] = '\0';
      buf[0x33] = '\0';
      buf[0x34] = '\0';
      buf[0x35] = '\0';
      buf[0x36] = '\0';
      buf[0x37] = '\0';
      buf[0x38] = '\0';
      buf[0x39] = '\0';
      buf[0x3a] = '\0';
      buf[0x3b] = '\0';
      buf[0x3c] = '\0';
      buf[0x3d] = '\0';
      buf[0x3e] = '\0';
      buf[0x3f] = '\0';
      buf[0x20] = '\0';
      buf[0x21] = '\0';
      buf[0x22] = '\0';
      buf[0x23] = '\0';
      buf[0x24] = '\0';
      buf[0x25] = '\0';
      buf[0x26] = '\0';
      buf[0x27] = '\0';
      buf[0x28] = '\0';
      buf[0x29] = '\0';
      buf[0x2a] = '\0';
      buf[0x2b] = '\0';
      buf[0x2c] = '\0';
      buf[0x2d] = '\0';
      buf[0x2e] = '\0';
      buf[0x2f] = '\0';
      buf[0x10] = '\0';
      buf[0x11] = '\0';
      buf[0x12] = '\0';
      buf[0x13] = '\0';
      buf[0x14] = '\0';
      buf[0x15] = '\0';
      buf[0x16] = '\0';
      buf[0x17] = '\0';
      buf[0x18] = '\0';
      buf[0x19] = '\0';
      buf[0x1a] = '\0';
      buf[0x1b] = '\0';
      buf[0x1c] = '\0';
      buf[0x1d] = '\0';
      buf[0x1e] = '\0';
      buf[0x1f] = '\0';
      buf[0] = '\0';
      buf[1] = '\0';
      buf[2] = '\0';
      buf[3] = '\0';
      buf[4] = '\0';
      buf[5] = '\0';
      buf[6] = '\0';
      buf[7] = '\0';
      buf[8] = '\0';
      buf[9] = '\0';
      buf[10] = '\0';
      buf[0xb] = '\0';
      buf[0xc] = '\0';
      buf[0xd] = '\0';
      buf[0xe] = '\0';
      buf[0xf] = '\0';
      so.lsa._4_8_ = 0;
      so.lsa._12_8_ = 0;
      so.lsa._20_8_ = 0;
      so.rsa._0_8_ = 0;
      so.rsa._8_1_ = '\0';
      so.rsa._9_1_ = '\0';
      so.rsa._10_1_ = '\0';
      so.rsa._11_1_ = '\0';
      so.rsa._12_1_ = '\0';
      so.rsa._13_1_ = '\0';
      so.rsa._14_1_ = '\0';
      so.rsa._15_1_ = '\0';
      so.rsa._16_8_ = 0;
      so._56_8_ = 0;
      so._0_8_ = 0x200000000;
      port = 0;
      puVar8 = (uint *)&len_1;
      len_1 = 0;
      iVar5 = __isoc99_sscanf(vec.ptr,"%u.%u.%u.%u:%u%n",&a,&b,&c,&d,&port,puVar8);
      if (iVar5 == 5) {
        uVar12 = b << 0x10 | a << 0x18;
        uVar6 = c << 8 | uVar12 | d;
        so.lsa.sin6.sin6_flowinfo =
             uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | d << 0x18;
        so.lsa.sin.sin_port = (ushort)port << 8 | (ushort)port >> 8;
        puVar8 = (uint *)(ulong)uVar12;
LAB_00122e6e:
        uVar6 = 4;
LAB_00122e73:
        uVar3 = so._56_8_;
        uVar12 = (uint)puVar8;
        uVar7 = (ulong)len_1;
        if ((0 < (long)uVar7) && (port < 0x10000)) {
          uVar15 = CONCAT44(vec.len._4_4_,(uint)vec.len);
          uVar12 = (uint)CONCAT71((int7)((ulong)puVar8 >> 8),uVar15 == uVar7);
          if (uVar7 + 1 == uVar15 || uVar15 == uVar7) {
            uVar12 = 0;
            if (uVar7 < uVar15) {
              uVar12 = (uint)vec.ptr[uVar7];
            }
            so.is_ssl = uVar12 == 0x73;
            so._62_2_ = SUB82(uVar3,6);
            so.ssl_redir = uVar12 == 0x72;
            bVar2 = false;
            if ((uVar12 - 0x72 < 2) || (bVar2 = false, uVar12 == 0)) goto LAB_00122ed8;
          }
        }
        bVar2 = true;
        uVar6 = 0;
      }
      else {
        puVar13 = &port;
        iVar5 = __isoc99_sscanf(vec.ptr,"[%49[^]]]:%u%n",buf);
        if ((iVar5 == 2) && ((ulong)(long)len_1 <= CONCAT44(vec.len._4_4_,(uint)vec.len))) {
          puVar13 = (uint *)0x1c;
          iVar5 = mg_inet_pton(10,buf,&so.lsa,0x1c,0);
          if (iVar5 == 0) goto LAB_00123046;
          so.lsa.sin.sin_port = (ushort)port << 8 | (ushort)port >> 8;
          uVar6 = 6;
          puVar8 = puVar13;
          goto LAB_00122e73;
        }
LAB_00123046:
        if ((*vec.ptr == '+') &&
           (iVar5 = __isoc99_sscanf(vec.ptr + 1,"%u%n",&port), puVar13 = puVar8, iVar5 == 1)) {
          len_1 = len_1 + 1;
          so.lsa.sa.sa_family = 10;
          so.lsa.sin.sin_port = (ushort)port << 8 | (ushort)port >> 8;
          uVar6 = 10;
          goto LAB_00122e73;
        }
        uVar7 = strtoul(vec.ptr,&endptr,0);
        pcVar19 = vec.ptr;
        puVar8 = puVar13;
        if ((uVar7 < 0x10000) && (puVar8 = (uint *)vec.ptr, vec.ptr != endptr)) {
          len_1 = (int)endptr - (int)vec.ptr;
          port = (uint)uVar7;
          so.lsa.sin.sin_port = (ushort)uVar7 << 8 | (ushort)uVar7 >> 8;
          goto LAB_00122e6e;
        }
        pcVar17 = strchr(vec.ptr,0x3a);
        if (pcVar17 == (char *)0x0) {
          len_1 = 0;
          uVar6 = 0;
          goto LAB_00122e73;
        }
        uVar7 = (long)pcVar17 - (long)pcVar19;
        bVar20 = uVar7 < CONCAT44(vec.len._4_4_,(uint)vec.len);
        uVar6 = 0;
        if (uVar7 < 0x100 && bVar20) {
          cVar4 = *pcVar19;
          pcVar9 = local_138;
          uVar15 = uVar7;
          if (pcVar17 != pcVar19 && cVar4 != '\0') {
            do {
              pcVar19 = pcVar19 + 1;
              *pcVar9 = cVar4;
              pcVar9 = pcVar9 + 1;
              cVar4 = *pcVar19;
              if (cVar4 == '\0') break;
              bVar2 = 1 < uVar15;
              uVar15 = uVar15 - 1;
            } while (bVar2);
          }
          iVar16 = (int)uVar7 + 1;
          *pcVar9 = '\0';
          iVar5 = mg_inet_pton(2,local_138,&so.lsa,0x10,1);
          if (iVar5 == 0) {
            puVar8 = (uint *)0x1c;
            iVar5 = mg_inet_pton(10,local_138,&so.lsa,0x1c,1);
            if (iVar5 == 0) {
              len_1 = 0;
            }
            else {
              puVar8 = (uint *)&len_1;
              iVar5 = __isoc99_sscanf(pcVar17 + 1,"%u%n",&port);
              if (iVar5 != 1) goto LAB_0012347f;
              so.lsa.sin.sin_port = (ushort)port << 8 | (ushort)port >> 8;
              len_1 = len_1 + iVar16;
              uVar6 = 6;
            }
          }
          else {
            puVar8 = (uint *)&len_1;
            iVar5 = __isoc99_sscanf(pcVar17 + 1,"%u%n",&port);
            if (iVar5 == 1) {
              so.lsa.sin.sin_port = (ushort)port << 8 | (ushort)port >> 8;
              len_1 = len_1 + iVar16;
              uVar6 = 4;
            }
            else {
LAB_0012347f:
              len_1 = 0;
            }
          }
        }
        uVar12 = (uint)puVar8;
        bVar2 = true;
        phys_ctx = local_1d8;
        if (uVar7 < 0x100 && bVar20) goto LAB_00122e73;
      }
LAB_00122ed8:
      local_268 = (char *)(ulong)((int)local_268 + 1);
      if (bVar2) {
        mg_cry_internal_wrap
                  ((mg_connection *)0x0,phys_ctx,local_268,0x16b048,
                   "%.*s: invalid port spec (entry %i). Expecting list of: %s",(ulong)(uint)vec.len,
                   vec.ptr,local_268,"[IP_ADDRESS:]PORT[s|r]");
      }
      else {
        iVar5 = socket((uint)so.lsa.sa.sa_family,1,6);
        so.sock = iVar5;
        if (iVar5 == -1) {
          mg_cry_internal_wrap
                    ((mg_connection *)0x0,phys_ctx,func,uVar12,"cannot create socket (entry %i)",
                     local_268);
        }
        else {
          piVar14 = &on;
          iVar5 = setsockopt(iVar5,1,2,piVar14,4);
          uVar12 = (uint)piVar14;
          pcVar19 = func_00;
          if (iVar5 != 0) {
            mg_cry_internal_wrap
                      ((mg_connection *)0x0,phys_ctx,func_00,uVar12,
                       "cannot set socket option SO_REUSEADDR (entry %i)",local_268);
            pcVar19 = extraout_RDX;
          }
          if (4 < uVar6) {
            if (uVar6 < 7) {
              if (so.lsa.sa.sa_family == 10) {
                piVar14 = &on;
                iVar5 = setsockopt(so.sock,0x29,0x1a,piVar14,4);
                uVar12 = (uint)piVar14;
                pcVar17 = "cannot set socket option IPV6_V6ONLY=on (entry %i)";
                pcVar19 = extraout_RDX_01;
                goto LAB_00123236;
              }
            }
            else if (so.lsa.sa.sa_family == 10) {
              piVar14 = &off;
              iVar5 = setsockopt(so.sock,0x29,0x1a,piVar14,4);
              uVar12 = (uint)piVar14;
              pcVar17 = "cannot set socket option IPV6_V6ONLY=off (entry %i)";
              pcVar19 = extraout_RDX_00;
LAB_00123236:
              if (iVar5 != 0) {
                mg_cry_internal_wrap((mg_connection *)0x0,phys_ctx,pcVar19,uVar12,pcVar17,local_268)
                ;
                pcVar19 = extraout_RDX_02;
              }
            }
          }
          if (so.lsa.sa.sa_family == 10) {
            len = 0x1c;
            iVar5 = bind(so.sock,(sockaddr *)&so.lsa.sa,0x1c);
            uVar6 = (uint)vec.len;
            pcVar19 = vec.ptr;
            if (iVar5 == 0) {
LAB_00123337:
              pcVar19 = (phys_ctx->dd).config[7];
              lVar10 = strtol(pcVar19,(char **)0x0,10);
              uVar7 = lVar10 - 0x80000000;
              if (uVar7 < 0xffffffff80000001) {
                mg_cry_internal_wrap
                          ((mg_connection *)0x0,phys_ctx,(char *)0xffffffff80000000,(uint)uVar7,
                           "%s value \"%s\" is invalid","listen_backlog",pcVar19);
                goto LAB_00123381;
              }
              iVar5 = listen(so.sock,(int)lVar10);
              uVar6 = (uint)vec.len;
              pcVar19 = vec.ptr;
              uVar12 = (uint)uVar7;
              if (iVar5 == 0) {
                iVar5 = getsockname(so.sock,(sockaddr *)&usa.sa,&len);
                if (iVar5 != 0) {
LAB_0012358a:
                  puVar8 = (uint *)__errno_location();
                  uVar6 = (uint)vec.len;
                  pcVar19 = vec.ptr;
                  uVar12 = *puVar8;
                  pcVar9 = strerror(uVar12);
                  pcVar18 = "call to getsockname failed %.*s: %d (%s)";
                  pcVar17 = extraout_RDX_06;
                  goto LAB_001235bf;
                }
                if (usa.sa.sa_family != so.lsa.sa.sa_family) goto LAB_0012358a;
                so.lsa.sin.sin_port = usa.sin.sin_port;
                __ptr = (socket *)
                        realloc(phys_ctx->listening_sockets,
                                (ulong)(phys_ctx->num_listening_sockets + 1) << 6);
                if (__ptr != (socket *)0x0) {
                  ppVar11 = (pollfd *)
                            realloc(phys_ctx->listening_socket_fds,
                                    (ulong)(phys_ctx->num_listening_sockets + 1) << 3);
                  if (ppVar11 == (pollfd *)0x0) {
                    mg_cry_internal_wrap
                              ((mg_connection *)0x0,phys_ctx,(char *)ctx,uVar12,"%s","Out of memory"
                              );
                    close(so.sock);
                    so.sock = -1;
                    free(__ptr);
                  }
                  else {
                    set_close_on_exec(so.sock,(mg_connection *)phys_ctx,ctx);
                    phys_ctx->listening_sockets = __ptr;
                    uVar6 = phys_ctx->num_listening_sockets;
                    puVar1 = (undefined8 *)((long)&__ptr[uVar6].rsa + 0x10);
                    *puVar1 = so.rsa._16_8_;
                    puVar1[1] = so._56_8_;
                    *(undefined8 *)&__ptr[uVar6].rsa = so.rsa._0_8_;
                    *(uchar (*) [8])((long)&__ptr[uVar6].rsa + 8) = so.rsa.sin.sin_zero;
                    puVar1 = (undefined8 *)((long)&__ptr[uVar6].lsa + 0xc);
                    *puVar1 = so.lsa._12_8_;
                    puVar1[1] = so.lsa._20_8_;
                    *(undefined8 *)(__ptr + uVar6) = so._0_8_;
                    *(undefined8 *)((long)&__ptr[uVar6].lsa + 4) = so.lsa._4_8_;
                    phys_ctx->listening_socket_fds = ppVar11;
                    phys_ctx->num_listening_sockets = uVar6 + 1;
                    local_1f8 = (ulong)((int)local_1f8 + 1);
                  }
                  goto LAB_0012339c;
                }
                mg_cry_internal_wrap
                          ((mg_connection *)0x0,phys_ctx,func_01,uVar12,"%s","Out of memory");
              }
              else {
                puVar8 = (uint *)__errno_location();
                uVar12 = *puVar8;
                pcVar9 = strerror(uVar12);
                pcVar18 = "cannot listen to %.*s: %d (%s)";
                pcVar17 = extraout_RDX_05;
LAB_001235bf:
                mg_cry_internal_wrap
                          ((mg_connection *)0x0,phys_ctx,pcVar17,(uint)pcVar9,pcVar18,(ulong)uVar6,
                           pcVar19,(ulong)uVar12,pcVar9);
              }
              close(so.sock);
            }
            else {
              puVar8 = (uint *)__errno_location();
              uVar12 = *puVar8;
              pcVar9 = strerror(uVar12);
              pcVar18 = "cannot bind to IPv6 %.*s: %d (%s)";
              pcVar17 = extraout_RDX_04;
LAB_001232f8:
              mg_cry_internal_wrap
                        ((mg_connection *)0x0,phys_ctx,pcVar17,(uint)pcVar9,pcVar18,(ulong)uVar6,
                         pcVar19,(ulong)uVar12,pcVar9);
LAB_00123381:
              close(so.sock);
            }
            so.sock = -1;
          }
          else {
            if (so.lsa.sa.sa_family == 2) {
              len = 0x10;
              iVar5 = bind(so.sock,(sockaddr *)&so.lsa.sa,0x10);
              uVar6 = (uint)vec.len;
              pcVar19 = vec.ptr;
              if (iVar5 != 0) {
                puVar8 = (uint *)__errno_location();
                uVar12 = *puVar8;
                pcVar9 = strerror(uVar12);
                pcVar18 = "cannot bind to %.*s: %d (%s)";
                pcVar17 = extraout_RDX_03;
                goto LAB_001232f8;
              }
              goto LAB_00123337;
            }
            mg_cry_internal_wrap
                      ((mg_connection *)0x0,phys_ctx,pcVar19,uVar12,
                       "cannot bind: address family not supported (entry %i)",local_268);
            close(so.sock);
            so.sock = -1;
          }
        }
      }
LAB_0012339c:
      list = next_option(list,&vec,(vec *)0x0);
    } while (list != (char *)0x0);
  }
  iVar5 = (int)local_1f8;
  if (iVar5 != (int)local_268) {
    close_all_listening_sockets(phys_ctx);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int
set_ports_option(struct mg_context *phys_ctx)
{
	const char *list;
	int on = 1;
#if defined(USE_IPV6)
	int off = 0;
#endif
	struct vec vec;
	struct socket so, *ptr;

	struct mg_pollfd *pfd;
	union usa usa;
	socklen_t len;
	int ip_version;

	int portsTotal = 0;
	int portsOk = 0;

	const char *opt_txt;
	long opt_listen_backlog;

	if (!phys_ctx) {
		return 0;
	}

	memset(&so, 0, sizeof(so));
	memset(&usa, 0, sizeof(usa));
	len = sizeof(usa);
	list = phys_ctx->dd.config[LISTENING_PORTS];

	while ((list = next_option(list, &vec, NULL)) != NULL) {

		portsTotal++;

		if (!parse_port_string(&vec, &so, &ip_version)) {
			mg_cry_ctx_internal(
			    phys_ctx,
			    "%.*s: invalid port spec (entry %i). Expecting list of: %s",
			    (int)vec.len,
			    vec.ptr,
			    portsTotal,
			    "[IP_ADDRESS:]PORT[s|r]");
			continue;
		}

#if !defined(NO_SSL)
		if (so.is_ssl && phys_ctx->dd.ssl_ctx == NULL) {

			mg_cry_ctx_internal(phys_ctx,
			                    "Cannot add SSL socket (entry %i)",
			                    portsTotal);
			continue;
		}
#endif
		/* Create socket. */
		/* For a list of protocol numbers (e.g., TCP==6) see:
		 * https://www.iana.org/assignments/protocol-numbers/protocol-numbers.xhtml
		 */
		if ((so.sock =
		         socket(so.lsa.sa.sa_family,
		                SOCK_STREAM,
		                (ip_version == 99) ? (/* LOCAL */ 0) : (/* TCP */ 6)))
		    == INVALID_SOCKET) {

			mg_cry_ctx_internal(phys_ctx,
			                    "cannot create socket (entry %i)",
			                    portsTotal);
			continue;
		}

#if defined(_WIN32)
		/* Windows SO_REUSEADDR lets many procs binds to a
		 * socket, SO_EXCLUSIVEADDRUSE makes the bind fail
		 * if someone already has the socket -- DTL */
		/* NOTE: If SO_EXCLUSIVEADDRUSE is used,
		 * Windows might need a few seconds before
		 * the same port can be used again in the
		 * same process, so a short Sleep may be
		 * required between mg_stop and mg_start.
		 */
		if (setsockopt(so.sock,
		               SOL_SOCKET,
		               SO_EXCLUSIVEADDRUSE,
		               (SOCK_OPT_TYPE)&on,
		               sizeof(on))
		    != 0) {

			/* Set reuse option, but don't abort on errors. */
			mg_cry_ctx_internal(
			    phys_ctx,
			    "cannot set socket option SO_EXCLUSIVEADDRUSE (entry %i)",
			    portsTotal);
		}
#else
		if (setsockopt(so.sock,
		               SOL_SOCKET,
		               SO_REUSEADDR,
		               (SOCK_OPT_TYPE)&on,
		               sizeof(on))
		    != 0) {

			/* Set reuse option, but don't abort on errors. */
			mg_cry_ctx_internal(
			    phys_ctx,
			    "cannot set socket option SO_REUSEADDR (entry %i)",
			    portsTotal);
		}
#endif

#if defined(USE_X_DOM_SOCKET)
		if (ip_version == 99) {
			/* Unix domain socket */
		} else
#endif

		    if (ip_version > 4) {
			/* Could be 6 for IPv6 onlyor 10 (4+6) for IPv4+IPv6 */
#if defined(USE_IPV6)
			if (ip_version > 6) {
				if (so.lsa.sa.sa_family == AF_INET6
				    && setsockopt(so.sock,
				                  IPPROTO_IPV6,
				                  IPV6_V6ONLY,
				                  (void *)&off,
				                  sizeof(off))
				           != 0) {

					/* Set IPv6 only option, but don't abort on errors. */
					mg_cry_ctx_internal(phys_ctx,
					                    "cannot set socket option "
					                    "IPV6_V6ONLY=off (entry %i)",
					                    portsTotal);
				}
			} else {
				if (so.lsa.sa.sa_family == AF_INET6
				    && setsockopt(so.sock,
				                  IPPROTO_IPV6,
				                  IPV6_V6ONLY,
				                  (void *)&on,
				                  sizeof(on))
				           != 0) {

					/* Set IPv6 only option, but don't abort on errors. */
					mg_cry_ctx_internal(phys_ctx,
					                    "cannot set socket option "
					                    "IPV6_V6ONLY=on (entry %i)",
					                    portsTotal);
				}
			}
#else
			mg_cry_ctx_internal(phys_ctx, "%s", "IPv6 not available");
			closesocket(so.sock);
			so.sock = INVALID_SOCKET;
			continue;
#endif
		}

		if (so.lsa.sa.sa_family == AF_INET) {

			len = sizeof(so.lsa.sin);
			if (bind(so.sock, &so.lsa.sa, len) != 0) {
				mg_cry_ctx_internal(phys_ctx,
				                    "cannot bind to %.*s: %d (%s)",
				                    (int)vec.len,
				                    vec.ptr,
				                    (int)ERRNO,
				                    strerror(errno));
				closesocket(so.sock);
				so.sock = INVALID_SOCKET;
				continue;
			}
		}
#if defined(USE_IPV6)
		else if (so.lsa.sa.sa_family == AF_INET6) {

			len = sizeof(so.lsa.sin6);
			if (bind(so.sock, &so.lsa.sa, len) != 0) {
				mg_cry_ctx_internal(phys_ctx,
				                    "cannot bind to IPv6 %.*s: %d (%s)",
				                    (int)vec.len,
				                    vec.ptr,
				                    (int)ERRNO,
				                    strerror(errno));
				closesocket(so.sock);
				so.sock = INVALID_SOCKET;
				continue;
			}
		}
#endif
#if defined(USE_X_DOM_SOCKET)
		else if (so.lsa.sa.sa_family == AF_UNIX) {

			len = sizeof(so.lsa.sun);
			if (bind(so.sock, &so.lsa.sa, len) != 0) {
				mg_cry_ctx_internal(phys_ctx,
				                    "cannot bind to unix socket %s: %d (%s)",
				                    so.lsa.sun.sun_path,
				                    (int)ERRNO,
				                    strerror(errno));
				closesocket(so.sock);
				so.sock = INVALID_SOCKET;
				continue;
			}
		}
#endif
		else {
			mg_cry_ctx_internal(
			    phys_ctx,
			    "cannot bind: address family not supported (entry %i)",
			    portsTotal);
			closesocket(so.sock);
			so.sock = INVALID_SOCKET;
			continue;
		}

		opt_txt = phys_ctx->dd.config[LISTEN_BACKLOG_SIZE];
		opt_listen_backlog = strtol(opt_txt, NULL, 10);
		if ((opt_listen_backlog > INT_MAX) || (opt_listen_backlog < 1)) {
			mg_cry_ctx_internal(phys_ctx,
			                    "%s value \"%s\" is invalid",
			                    config_options[LISTEN_BACKLOG_SIZE].name,
			                    opt_txt);
			closesocket(so.sock);
			so.sock = INVALID_SOCKET;
			continue;
		}

		if (listen(so.sock, (int)opt_listen_backlog) != 0) {

			mg_cry_ctx_internal(phys_ctx,
			                    "cannot listen to %.*s: %d (%s)",
			                    (int)vec.len,
			                    vec.ptr,
			                    (int)ERRNO,
			                    strerror(errno));
			closesocket(so.sock);
			so.sock = INVALID_SOCKET;
			continue;
		}

		if ((getsockname(so.sock, &(usa.sa), &len) != 0)
		    || (usa.sa.sa_family != so.lsa.sa.sa_family)) {

			int err = (int)ERRNO;
			mg_cry_ctx_internal(phys_ctx,
			                    "call to getsockname failed %.*s: %d (%s)",
			                    (int)vec.len,
			                    vec.ptr,
			                    err,
			                    strerror(errno));
			closesocket(so.sock);
			so.sock = INVALID_SOCKET;
			continue;
		}

		/* Update lsa port in case of random free ports */
#if defined(USE_IPV6)
		if (so.lsa.sa.sa_family == AF_INET6) {
			so.lsa.sin6.sin6_port = usa.sin6.sin6_port;
		} else
#endif
		{
			so.lsa.sin.sin_port = usa.sin.sin_port;
		}

		if ((ptr = (struct socket *)
		         mg_realloc_ctx(phys_ctx->listening_sockets,
		                        (phys_ctx->num_listening_sockets + 1)
		                            * sizeof(phys_ctx->listening_sockets[0]),
		                        phys_ctx))
		    == NULL) {

			mg_cry_ctx_internal(phys_ctx, "%s", "Out of memory");
			closesocket(so.sock);
			so.sock = INVALID_SOCKET;
			continue;
		}

		if ((pfd = (struct mg_pollfd *)
		         mg_realloc_ctx(phys_ctx->listening_socket_fds,
		                        (phys_ctx->num_listening_sockets + 1)
		                            * sizeof(phys_ctx->listening_socket_fds[0]),
		                        phys_ctx))
		    == NULL) {

			mg_cry_ctx_internal(phys_ctx, "%s", "Out of memory");
			closesocket(so.sock);
			so.sock = INVALID_SOCKET;
			mg_free(ptr);
			continue;
		}

		set_close_on_exec(so.sock, NULL, phys_ctx);
		phys_ctx->listening_sockets = ptr;
		phys_ctx->listening_sockets[phys_ctx->num_listening_sockets] = so;
		phys_ctx->listening_socket_fds = pfd;
		phys_ctx->num_listening_sockets++;
		portsOk++;
	}

	if (portsOk != portsTotal) {
		close_all_listening_sockets(phys_ctx);
		portsOk = 0;
	}

	return portsOk;
}